

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O0

void test_async_send_recv(void)

{
  ostream *poVar1;
  runtime_error *this;
  ostringstream oss;
  async_writer wrt;
  async_reader rdr;
  vector<char,_std::allocator<char>_> out;
  vector<char,_std::allocator<char>_> in;
  stream_socket s2;
  stream_socket s1;
  io_service srv;
  allocator_type *in_stack_fffffffffffffd38;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  size_type in_stack_fffffffffffffd48;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  string local_288 [32];
  ostringstream local_268 [24];
  async_reader *in_stack_fffffffffffffdb0;
  stream_socket *in_stack_fffffffffffffdb8;
  stream_socket *in_stack_fffffffffffffdc0;
  async_writer *in_stack_fffffffffffffe10;
  allocator<char> local_ba;
  undefined1 local_b9;
  allocator<char> local_9a;
  undefined1 local_99;
  stream_socket local_80 [64];
  stream_socket local_40 [48];
  io_service local_10 [16];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test async send/recv");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  booster::aio::io_service::io_service(local_10);
  booster::aio::stream_socket::stream_socket(local_40,local_10);
  booster::aio::stream_socket::stream_socket(local_80,local_10);
  reset_glb(local_10);
  make_pair(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_99 = 0;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type_conflict *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::allocator<char>::~allocator(&local_9a);
  local_b9 = 0;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type_conflict *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::allocator<char>::~allocator(&local_ba);
  async_reader::run(in_stack_fffffffffffffdb0);
  async_writer::run(in_stack_fffffffffffffe10);
  booster::aio::io_service::run();
  if (calls_no == 6) {
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffd40);
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffd40);
    booster::aio::stream_socket::~stream_socket(local_80);
    booster::aio::stream_socket::~stream_socket(local_40);
    booster::aio::io_service::~io_service(local_10);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_268);
  poVar1 = std::operator<<((ostream *)local_268,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1bd);
  std::operator<<(poVar1," calls_no == 6");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_288);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_async_send_recv()
{
	std::cout << "Test async send/recv" << std::endl;
	io::io_service srv;
	io::stream_socket s1(srv),s2(srv);
	reset_glb(srv);
	make_pair(s1,s2);
	std::vector<char> in(151,0),out(190,0);
	async_reader rdr = { 0, &s1, &in };
	async_writer wrt = { 0, &s2, &out };
	rdr.run();
	wrt.run();
	srv.run();
	TEST(calls_no == 6);
}